

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall
testing::StrictMock<MockBinaryLogicalVisitor>::StrictMock
          (StrictMock<MockBinaryLogicalVisitor> *this)

{
  FunctionMocker<TestResult_(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>)>
  *this_00;
  
  (this->super_MockBinaryLogicalVisitor).super_ExprVisitor<MockBinaryLogicalVisitor,_TestResult>.
  super_BasicExprVisitor<MockBinaryLogicalVisitor,_TestResult,_mp::internal::ExprTypes>.
  _vptr_BasicExprVisitor = (_func_int **)&PTR__MockBinaryLogicalVisitor_001e5bf0;
  this_00 = &(this->super_MockBinaryLogicalVisitor).gmock1_VisitBinaryLogical_422;
  internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)this_00);
  (this->super_MockBinaryLogicalVisitor).gmock1_VisitBinaryLogical_422.
  super_FunctionMockerBase<TestResult_(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>)>
  .current_spec_.function_mocker_ =
       &this_00->
        super_FunctionMockerBase<TestResult_(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>)>
  ;
  ((linked_ptr<const_testing::MatcherInterface<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>_>_>
    *)((long)&(this->super_MockBinaryLogicalVisitor).gmock1_VisitBinaryLogical_422.
              super_FunctionMockerBase<TestResult_(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>)>
              .current_spec_.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>_>_>
              .
              super__Head_base<0UL,_testing::Matcher<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>_>,_false>
      + 8))->value_ =
       (MatcherInterface<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>_>
        *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->super_MockBinaryLogicalVisitor).gmock1_VisitBinaryLogical_422.
          super_FunctionMockerBase<TestResult_(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>_>_>
          .
          super__Head_base<0UL,_testing::Matcher<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>_>,_false>
  + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->super_MockBinaryLogicalVisitor).gmock1_VisitBinaryLogical_422.
               super_FunctionMockerBase<TestResult_(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>_>_>
               .
               super__Head_base<0UL,_testing::Matcher<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>_>,_false>
       + 0x10);
  (this->super_MockBinaryLogicalVisitor).gmock1_VisitBinaryLogical_422.
  super_FunctionMockerBase<TestResult_(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>)>
  .current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>_>_>
  .
  super__Head_base<0UL,_testing::Matcher<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>_>,_false>
  ._M_head_impl.
  super_MatcherBase<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>_>
  ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001e2218;
  (this->super_MockBinaryLogicalVisitor).gmock1_VisitBinaryLogical_422.
  super_FunctionMockerBase<TestResult_(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>)>
  .super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_001e2148;
  (this->super_MockBinaryLogicalVisitor).super_ExprVisitor<MockBinaryLogicalVisitor,_TestResult>.
  super_BasicExprVisitor<MockBinaryLogicalVisitor,_TestResult,_mp::internal::ExprTypes>.
  _vptr_BasicExprVisitor = (_func_int **)&PTR__StrictMock_001e5b78;
  Mock::FailUninterestingCalls(this);
  return;
}

Assistant:

StrictMock() {
    ::testing::Mock::FailUninterestingCalls(
        internal::ImplicitCast_<MockClass*>(this));
  }